

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_compute.cpp
# Opt level: O1

int device_initialization(Init *init)

{
  InstanceBuilder *pIVar1;
  ostream *poVar2;
  fd_set *in_RCX;
  fd_set *__readfds;
  int iVar3;
  fd_set *in_R8;
  timeval *in_R9;
  Result<vkb::Instance> instance_ret;
  InstanceBuilder instance_builder;
  PhysicalDeviceSelector phys_device_selector;
  Result<vkb::Device> device_ret;
  PhysicalDevice physical_device;
  Result<vkb::PhysicalDevice> phys_device_ret;
  DeviceBuilder device_builder;
  anon_union_56_2_293c120a_for_Result<vkb::Instance>_1 local_3978;
  char local_3940;
  InstanceBuilder local_3938;
  PhysicalDeviceSelector local_3850;
  undefined1 local_35f8 [1656];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2f80;
  vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_> local_2f68;
  vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  local_2f50;
  undefined1 local_2f38;
  undefined1 uStack_2f37;
  undefined2 uStack_2f36;
  undefined4 uStack_2f34;
  undefined8 local_2f30;
  vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_> local_2f28 [2];
  undefined8 uStack_2ef8;
  undefined8 local_2ef0;
  bool local_2ee8;
  PhysicalDevice local_2ee0;
  PhysicalDevice local_2820;
  DispatchTable local_2160;
  anon_union_1728_2_293c120a_for_Result<vkb::PhysicalDevice>_1 local_dd8;
  char local_718;
  DeviceBuilder local_710;
  
  vkb::InstanceBuilder::InstanceBuilder(&local_3938);
  pIVar1 = vkb::InstanceBuilder::use_default_debug_messenger(&local_3938);
  pIVar1 = vkb::InstanceBuilder::request_validation_layers(pIVar1,true);
  pIVar1 = vkb::InstanceBuilder::set_headless(pIVar1,true);
  vkb::InstanceBuilder::build((Result<vkb::Instance> *)&local_3978.m_value,pIVar1);
  if (local_3940 == '\0') {
    (**(code **)(*(long *)local_3978.m_value.debug_messenger + 0x20))
              (&local_2160,local_3978.m_value.debug_messenger,local_3978.m_error.type._M_value);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_2160.fp_vkGetDeviceQueue,
                        (long)local_2160.fp_vkQueueSubmit);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    if ((PFN_vkQueueWaitIdle *)local_2160.fp_vkGetDeviceQueue != &local_2160.fp_vkQueueWaitIdle) {
      operator_delete(local_2160.fp_vkGetDeviceQueue,(ulong)(local_2160.fp_vkQueueWaitIdle + 1));
    }
    iVar3 = -1;
  }
  else {
    (init->instance).headless = (bool)local_3978._48_1_;
    (init->instance).properties2_ext_enabled = local_3978.m_value.properties2_ext_enabled;
    (init->instance).fp_vkGetDeviceProcAddr = local_3978.m_value.fp_vkGetDeviceProcAddr;
    (init->instance).instance_version = local_3978._40_4_;
    (init->instance).api_version = local_3978.m_value.api_version;
    (init->instance).allocation_callbacks = local_3978.m_value.allocation_callbacks;
    (init->instance).fp_vkGetInstanceProcAddr = local_3978.m_value.fp_vkGetInstanceProcAddr;
    (init->instance).instance =
         (VkInstance)CONCAT44(local_3978._4_4_,local_3978.m_error.type._M_value);
    (init->instance).debug_messenger = local_3978.m_value.debug_messenger;
    vkb::Instance::make_table((InstanceDispatchTable *)&local_2160,&init->instance);
    memcpy(&init->inst_disp,&local_2160,0x379);
    vkb::PhysicalDeviceSelector::PhysicalDeviceSelector(&local_3850,&init->instance);
    vkb::PhysicalDeviceSelector::select
              ((PhysicalDeviceSelector *)&local_dd8.m_value,(int)&local_3850,__readfds,in_RCX,in_R8,
               in_R9);
    if (local_718 == '\0') {
      (**(code **)(*(long *)local_dd8.m_error.type._M_cat + 0x20))
                (&local_2160,local_dd8.m_value.name._M_string_length,local_dd8.m_error.type._M_value
                );
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_2160.fp_vkGetDeviceQueue,
                          (long)local_2160.fp_vkQueueSubmit);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      if ((PFN_vkQueueWaitIdle *)local_2160.fp_vkGetDeviceQueue != &local_2160.fp_vkQueueWaitIdle) {
        operator_delete(local_2160.fp_vkGetDeviceQueue,(ulong)(local_2160.fp_vkQueueWaitIdle + 1));
      }
      iVar3 = -1;
    }
    else {
      vkb::PhysicalDevice::PhysicalDevice(&local_2820,&local_dd8.m_value);
      vkb::PhysicalDevice::PhysicalDevice(&local_2ee0,&local_2820);
      vkb::DeviceBuilder::DeviceBuilder(&local_710,&local_2ee0);
      if (local_2ee0.extended_features_chain.nodes.
          super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2ee0.extended_features_chain.nodes.
                        super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2ee0.extended_features_chain.nodes.
                              super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2ee0.extended_features_chain.nodes.
                              super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_2ee0.queue_families.
          super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2ee0.queue_families.
                        super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2ee0.queue_families.
                              super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2ee0.queue_families.
                              super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_2ee0.available_extensions);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_2ee0.extensions_to_enable);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2ee0.name._M_dataplus._M_p != &local_2ee0.name.field_2) {
        operator_delete(local_2ee0.name._M_dataplus._M_p,
                        local_2ee0.name.field_2._M_allocated_capacity + 1);
      }
      vkb::DeviceBuilder::build((Result<vkb::Device> *)local_35f8,&local_710);
      if (local_2ee8 == false) {
        (**(code **)(*(long *)local_35f8._8_8_ + 0x20))
                  (&local_2160,local_35f8._8_8_,local_35f8._0_4_);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_2160.fp_vkGetDeviceQueue,
                            (long)local_2160.fp_vkQueueSubmit);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
        if ((PFN_vkQueueWaitIdle *)local_2160.fp_vkGetDeviceQueue != &local_2160.fp_vkQueueWaitIdle)
        {
          operator_delete(local_2160.fp_vkGetDeviceQueue,(ulong)(local_2160.fp_vkQueueWaitIdle + 1))
          ;
        }
        iVar3 = -1;
      }
      else {
        (init->device).device = (VkDevice)CONCAT44(local_35f8._4_4_,local_35f8._0_4_);
        std::__cxx11::string::_M_assign((string *)&(init->device).physical_device);
        memcpy(&(init->device).physical_device.physical_device,local_35f8 + 0x28,0x634);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&(init->device).physical_device.extensions_to_enable,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_35f8 + 0x660));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&(init->device).physical_device.available_extensions,&local_2f80);
        std::vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>::operator=
                  (&(init->device).physical_device.queue_families,&local_2f68);
        std::
        vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
        ::operator=(&(init->device).physical_device.extended_features_chain.nodes,&local_2f50);
        (init->device).physical_device.defer_surface_initialization = (bool)local_2f38;
        (init->device).physical_device.properties2_ext_enabled = (bool)uStack_2f37;
        *(undefined2 *)&(init->device).physical_device.field_0x6ba = uStack_2f36;
        (init->device).physical_device.suitable = uStack_2f34;
        (init->device).surface = (VkSurfaceKHR)local_2f30;
        std::vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>::operator=
                  (&(init->device).queue_families,local_2f28);
        (init->device).internal_table.fp_vkDestroyDevice = (PFN_vkDestroyDevice)local_2ef0;
        *(pointer *)&(init->device).instance_version =
             local_2f28[1].
             super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        (init->device).internal_table.fp_vkGetDeviceQueue = (PFN_vkGetDeviceQueue)uStack_2ef8;
        (init->device).allocation_callbacks =
             (VkAllocationCallbacks *)
             local_2f28[1].
             super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>.
             _M_impl.super__Vector_impl_data._M_start;
        (init->device).fp_vkGetDeviceProcAddr =
             (PFN_vkGetDeviceProcAddr)
             local_2f28[1].
             super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        vkb::Device::make_table(&local_2160,&init->device);
        memcpy(&init->disp,&local_2160,0x1381);
        iVar3 = 0;
      }
      vkb::Result<vkb::Device>::destroy((Result<vkb::Device> *)local_35f8);
      vkb::DeviceBuilder::~DeviceBuilder(&local_710);
      if (local_2820.extended_features_chain.nodes.
          super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2820.extended_features_chain.nodes.
                        super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2820.extended_features_chain.nodes.
                              super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2820.extended_features_chain.nodes.
                              super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_2820.queue_families.
          super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2820.queue_families.
                        super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2820.queue_families.
                              super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2820.queue_families.
                              super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_2820.available_extensions);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_2820.extensions_to_enable);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2820.name._M_dataplus._M_p != &local_2820.name.field_2) {
        operator_delete(local_2820.name._M_dataplus._M_p,
                        local_2820.name.field_2._M_allocated_capacity + 1);
      }
    }
    vkb::Result<vkb::PhysicalDevice>::destroy((Result<vkb::PhysicalDevice> *)&local_dd8.m_value);
    if (local_3850.criteria.extended_features_chain.nodes.
        super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_3850.criteria.extended_features_chain.nodes.
                      super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_3850.criteria.extended_features_chain.nodes.
                            super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_3850.criteria.extended_features_chain.nodes.
                            super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_3850.criteria.required_extensions);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3850.criteria.name._M_dataplus._M_p != &local_3850.criteria.name.field_2) {
      operator_delete(local_3850.criteria.name._M_dataplus._M_p,
                      local_3850.criteria.name.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_3938.info.disabled_validation_features.
      super__Vector_base<VkValidationFeatureDisableEXT,_std::allocator<VkValidationFeatureDisableEXT>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3938.info.disabled_validation_features.
                    super__Vector_base<VkValidationFeatureDisableEXT,_std::allocator<VkValidationFeatureDisableEXT>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_3938.info.disabled_validation_features.
                          super__Vector_base<VkValidationFeatureDisableEXT,_std::allocator<VkValidationFeatureDisableEXT>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3938.info.disabled_validation_features.
                          super__Vector_base<VkValidationFeatureDisableEXT,_std::allocator<VkValidationFeatureDisableEXT>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3938.info.enabled_validation_features.
      super__Vector_base<VkValidationFeatureEnableEXT,_std::allocator<VkValidationFeatureEnableEXT>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3938.info.enabled_validation_features.
                    super__Vector_base<VkValidationFeatureEnableEXT,_std::allocator<VkValidationFeatureEnableEXT>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_3938.info.enabled_validation_features.
                          super__Vector_base<VkValidationFeatureEnableEXT,_std::allocator<VkValidationFeatureEnableEXT>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3938.info.enabled_validation_features.
                          super__Vector_base<VkValidationFeatureEnableEXT,_std::allocator<VkValidationFeatureEnableEXT>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3938.info.disabled_validation_checks.
      super__Vector_base<VkValidationCheckEXT,_std::allocator<VkValidationCheckEXT>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3938.info.disabled_validation_checks.
                    super__Vector_base<VkValidationCheckEXT,_std::allocator<VkValidationCheckEXT>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_3938.info.disabled_validation_checks.
                          super__Vector_base<VkValidationCheckEXT,_std::allocator<VkValidationCheckEXT>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3938.info.disabled_validation_checks.
                          super__Vector_base<VkValidationCheckEXT,_std::allocator<VkValidationCheckEXT>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3938.info.pNext_elements.
      super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3938.info.pNext_elements.
                    super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_3938.info.pNext_elements.
                          super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3938.info.pNext_elements.
                          super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3938.info.extensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3938.info.extensions.
                    super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3938.info.extensions.
                          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3938.info.extensions.
                          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_3938.info.layers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3938.info.layers.
                    super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3938.info.layers.
                          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3938.info.layers.
                          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return iVar3;
}

Assistant:

int device_initialization(Init& init) {
    vkb::InstanceBuilder instance_builder;
    auto instance_ret = instance_builder.use_default_debug_messenger()
                            .request_validation_layers()
                            .set_headless() // Skip vk-bootstrap trying to create WSI for you
                            .build();
    if (!instance_ret) {
        std::cout << instance_ret.error().message() << "\n";
        return -1;
    }
    init.instance = instance_ret.value();

    init.inst_disp = init.instance.make_table();

    vkb::PhysicalDeviceSelector phys_device_selector(init.instance);
    auto phys_device_ret = phys_device_selector.select();
    if (!phys_device_ret) {
        std::cout << phys_device_ret.error().message() << "\n";
        return -1;
    }
    vkb::PhysicalDevice physical_device = phys_device_ret.value();

    vkb::DeviceBuilder device_builder{ physical_device };
    auto device_ret = device_builder.build();
    if (!device_ret) {
        std::cout << device_ret.error().message() << "\n";
        return -1;
    }
    init.device = device_ret.value();

    init.disp = init.device.make_table();

    return 0;
}